

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_complete16(void *zSql)

{
  sqlite3_value *v;
  char *zSql_00;
  undefined4 local_2c;
  int rc;
  char *zSql8;
  sqlite3_value *pVal;
  void *zSql_local;
  
  zSql_local._4_4_ = sqlite3_initialize();
  if (zSql_local._4_4_ == 0) {
    v = sqlite3ValueNew((sqlite3 *)0x0);
    sqlite3ValueSetStr(v,-1,zSql,'\x02',(_func_void_void_ptr *)0x0);
    zSql_00 = (char *)sqlite3ValueText(v,'\x01');
    if (zSql_00 == (char *)0x0) {
      local_2c = 7;
    }
    else {
      local_2c = sqlite3_complete(zSql_00);
    }
    sqlite3ValueFree(v);
    zSql_local._4_4_ = local_2c & 0xff;
  }
  return zSql_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_complete16(const void *zSql){
  sqlite3_value *pVal;
  char const *zSql8;
  int rc;

#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zSql, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zSql8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zSql8 ){
    rc = sqlite3_complete(zSql8);
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);
  return rc & 0xff;
}